

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_lib.cpp
# Opt level: O1

bool install_emmy_debugger(lua_State *L)

{
  bool bVar1;
  EmmyFacade *pEVar2;
  EmmyDebuggerManager *pEVar3;
  
  pEVar2 = EmmyFacade::Get();
  bVar1 = EmmyFacade::SetupLuaAPI(pEVar2);
  if (bVar1) {
    pEVar2 = EmmyFacade::Get();
    pEVar3 = EmmyFacade::GetDebugManager(pEVar2);
    ExtensionPoint::Initialize(&pEVar3->extension,L);
    handleStateClose(L);
  }
  return bVar1;
}

Assistant:

bool install_emmy_debugger(struct lua_State* L)
{
#ifndef EMMY_USE_LUA_SOURCE
	if (!EmmyFacade::Get().SetupLuaAPI())
	{
		return false;
	}
#endif
	// register helper lib
	EmmyFacade::Get().GetDebugManager().extension.Initialize(L);
	handleStateClose(L);
	return true;
}